

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O1

Result __thiscall
wabt::ReadFile(wabt *this,string_view filename,
              vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data)

{
  wabt *this_00;
  int iVar1;
  Result RVar2;
  FILE *__stream;
  size_type __new_size;
  size_t sVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data_00;
  void *__s1;
  char *__s;
  size_type __rlen;
  string filename_str;
  stat statbuf;
  wabt *local_d8 [2];
  long local_c8 [2];
  stat local_b8;
  
  out_data_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)filename._M_str;
  __s1 = (void *)filename._M_len;
  local_d8[0] = (wabt *)local_c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d8,__s1,(wabt *)((long)__s1 + (long)this));
  this_00 = local_d8[0];
  if (this == (wabt *)0x1) {
    iVar1 = bcmp(__s1,"-",1);
    if (iVar1 == 0) {
      RVar2 = ReadAll(_stdin,"stdin",out_data_00);
      goto LAB_001162bc;
    }
  }
  iVar1 = stat((char *)this_00,&local_b8);
  if (iVar1 < 0) {
    ReadFile(this_00);
  }
  else if ((local_b8.st_mode._1_1_ & 0x40) == 0) {
    __stream = fopen((char *)this_00,"rb");
    if (__stream == (FILE *)0x0) {
      ReadFile(this_00);
    }
    else {
      iVar1 = fseek(__stream,0,2);
      if (iVar1 < 0) {
        RVar2 = ReadAll((FILE *)__stream,(char *)this_00,out_data_00);
        fclose(__stream);
        goto LAB_001162bc;
      }
      __new_size = ftell(__stream);
      if ((long)__new_size < 0) {
        __s = "ftell failed";
      }
      else {
        iVar1 = fseek(__stream,0,0);
        if (-1 < iVar1) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(out_data_00,__new_size)
          ;
          if (__new_size != 0) {
            sVar3 = fread((out_data_00->
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                          .super__Vector_impl_data._M_start,__new_size,1,__stream);
            if (sVar3 != 1) {
              ReadFile();
              goto LAB_001162b7;
            }
          }
          fclose(__stream);
          RVar2.enum_ = Ok;
          goto LAB_001162bc;
        }
        __s = "fseek to beginning failed";
      }
      perror(__s);
      fclose(__stream);
    }
  }
  else {
    fprintf(_stderr,"%s: is a directory\n",this_00);
  }
LAB_001162b7:
  RVar2.enum_ = Error;
LAB_001162bc:
  if (local_d8[0] != (wabt *)local_c8) {
    operator_delete(local_d8[0],local_c8[0] + 1);
  }
  return (Result)RVar2.enum_;
}

Assistant:

Result ReadFile(std::string_view filename, std::vector<uint8_t>* out_data) {
  std::string filename_str(filename);
  const char* filename_cstr = filename_str.c_str();

  if (filename == "-") {
    return ReadAll(stdin, "stdin", out_data);
  }

  struct stat statbuf;
  if (stat(filename_cstr, &statbuf) < 0) {
    fprintf(stderr, "%s: %s\n", filename_cstr, strerror(errno));
    return Result::Error;
  }

  if (statbuf.st_mode & S_IFDIR) {
    fprintf(stderr, "%s: is a directory\n", filename_cstr);
    return Result::Error;
  }

  FILE* infile = fopen(filename_cstr, "rb");
  if (!infile) {
    fprintf(stderr, "%s: %s\n", filename_cstr, strerror(errno));
    return Result::Error;
  }

  if (fseek(infile, 0, SEEK_END) < 0) {
    // not seekable, so we can't pre-allocate out_data, but let's try and read
    // it anyway (for pipes, sockets, etc.)
    auto res = ReadAll(infile, filename_cstr, out_data);
    fclose(infile);
    return res;
  }

  long size = ftell(infile);
  if (size < 0) {
    perror("ftell failed");
    fclose(infile);
    return Result::Error;
  }

  if (fseek(infile, 0, SEEK_SET) < 0) {
    perror("fseek to beginning failed");
    fclose(infile);
    return Result::Error;
  }

  out_data->resize(size);
  if (size != 0 && fread(out_data->data(), size, 1, infile) != 1) {
    fprintf(stderr, "%s: fread failed: %s\n", filename_cstr, strerror(errno));
    fclose(infile);
    return Result::Error;
  }

  fclose(infile);
  return Result::Ok;
}